

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O0

void NJD_clear(NJD *njd)

{
  long lVar1;
  long *in_RDI;
  NJDNode *node;
  
  while (*in_RDI != 0) {
    lVar1 = *(long *)(*in_RDI + 0x70);
    NJDNode_clear((NJDNode *)0x1fe112);
    free((void *)*in_RDI);
    *in_RDI = lVar1;
  }
  in_RDI[1] = 0;
  return;
}

Assistant:

void NJD_clear(NJD * njd)
{
   NJDNode *node;

   while (njd->head != NULL) {
      node = njd->head->next;
      NJDNode_clear(njd->head);
      free(njd->head);
      njd->head = node;
   }
   njd->tail = NULL;
}